

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_162::GlobalTypeOptimization::run(GlobalTypeOptimization *this,Module *module)

{
  pointer *this_00;
  __node_base_ptr *this_01;
  value_type vVar1;
  uint uVar2;
  bool bVar3;
  PassOptions *pPVar4;
  PassRunner *pPVar5;
  reference pHVar6;
  size_type sVar7;
  Struct *this_02;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *this_03;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *this_04;
  size_type sVar8;
  const_reference pvVar9;
  FieldInfo *pFVar10;
  HeapType *pHVar11;
  Struct *pSVar12;
  pointer ppVar13;
  mapped_type *this_05;
  ulong uVar14;
  size_type sVar15;
  pointer ppVar16;
  uint *puVar17;
  reference puVar18;
  size_type sVar19;
  reference pvVar20;
  mapped_type *this_06;
  function<std::optional<wasm::HeapType>_(wasm::HeapType)> *getSuper;
  optional<wasm::HeapType> oVar21;
  reference rVar22;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar23;
  bool local_7b2;
  byte local_789;
  byte local_739;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_690;
  uint local_678;
  uint local_674;
  Index i_4;
  uint i_3;
  iterator __end5;
  iterator __begin5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range5;
  value_type local_650;
  key_type local_64c;
  value_type superIndex;
  Index i_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> keptFieldsNotInSuper;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
  local_618;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
  local_610;
  iterator iter_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> superIndexes;
  uint local_5e8;
  Index numSuperFields;
  Index next;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexesAfterRemoval;
  _Storage<wasm::HeapType,_true> _Stack_5c0;
  bool superHasUpdates;
  optional<wasm::HeapType> super;
  value_type_conflict2 local_59c;
  undefined1 local_598 [2];
  bool hasNoReadsOrWritesInSupers;
  bool hasNoReadsAnywhere;
  Index i_1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> removableIndexes;
  mapped_type *vec;
  _Bit_type local_548;
  vector<bool,_std::allocator<bool>_> *local_540;
  vector<bool,_std::allocator<bool>_> *superVec;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
  local_530;
  iterator iter;
  optional<wasm::HeapType> super_1;
  Index i;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *dataFromSupers;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *dataFromSubsAndSupers;
  FieldList *fields;
  HeapType type;
  iterator __end2;
  iterator __begin2;
  function<std::optional<wasm::HeapType>_(wasm::HeapType)> local_4c8;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_4a8;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_490;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
  local_480;
  __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
  local_478;
  undefined1 local_470 [8];
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  publicTypesSet;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> publicTypes;
  type dataFromSupersMap;
  StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> dataFromSubsAndSupersMap;
  TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> propagator;
  FieldInfoScanner scanner;
  FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> functionSetGetInfos;
  FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> functionNewInfos;
  Fatal local_1a0;
  Module *local_18;
  Module *module_local;
  GlobalTypeOptimization *this_local;
  
  local_18 = module;
  module_local = (Module *)this;
  bVar3 = FeatureSet::hasGC(&module->features);
  if (bVar3) {
    pPVar4 = Pass::getPassOptions(&this->super_Pass);
    if ((pPVar4->closedWorld & 1U) == 0) {
      Fatal::Fatal(&local_1a0);
      Fatal::operator<<(&local_1a0,(char (*) [28])"GTO requires --closed-world");
      Fatal::~Fatal(&local_1a0);
    }
    StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::
    FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &functionSetGetInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket,local_18);
    StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::
    FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &scanner.
                super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
                .functionSetGetInfos,local_18);
    FieldInfoScanner::FieldInfoScanner
              ((FieldInfoScanner *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
               (FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &functionSetGetInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket,
               (FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &scanner.
                super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
                .functionSetGetInfos);
    pPVar5 = Pass::getPassRunner(&this->super_Pass);
    WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
           *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,pPVar5,local_18);
    pPVar5 = Pass::getPassRunner(&this->super_Pass);
    WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
    ::runOnModuleCode((WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
                       *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,pPVar5,local_18);
    StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::combineInto
              ((FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &scanner.
                super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
                .functionSetGetInfos,&this->combinedSetGetInfos);
    StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo>::
    TypeHierarchyPropagator
              ((TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> *)
               &dataFromSubsAndSupersMap.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket,local_18);
    StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::StructValuesMap
              ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &dataFromSupersMap.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket,&this->combinedSetGetInfos);
    StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo>::
    propagateToSuperAndSubTypes
              ((TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> *)
               &dataFromSubsAndSupersMap.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket,
               (StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &dataFromSupersMap.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket);
    this_00 = &publicTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::StructValuesMap
              ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)this_00,
               &this->combinedSetGetInfos);
    StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo>::
    propagateToSubTypes((TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> *)
                        &dataFromSubsAndSupersMap.
                         super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                         ._M_h._M_single_bucket,
                        (StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)this_00);
    wasm::ModuleUtils::getPublicHeapTypes
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &publicTypesSet._M_h._M_single_bucket,local_18);
    this_01 = &publicTypesSet._M_h._M_single_bucket;
    local_478._M_current =
         (HeapType *)
         std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                   ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this_01);
    local_480._M_current =
         (HeapType *)
         std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                   ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this_01);
    std::allocator<wasm::HeapType>::allocator((allocator<wasm::HeapType> *)((long)&__range2 + 5));
    getSuper = (function<std::optional<wasm::HeapType>_(wasm::HeapType)> *)0x0;
    std::
    unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>
    ::
    unordered_set<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
              ((unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>
                *)local_470,local_478,local_480,0,(hasher *)((long)&__range2 + 7),
               (key_equal *)((long)&__range2 + 6),(allocator<wasm::HeapType> *)((long)&__range2 + 5)
              );
    std::allocator<wasm::HeapType>::~allocator((allocator<wasm::HeapType> *)((long)&__range2 + 5));
    std::function<std::optional<wasm::HeapType>(wasm::HeapType)>::
    function<wasm::HeapTypeOrdering::supertypesFirst<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>(std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const&,std::function<std::optional<wasm::HeapType>(wasm::HeapType)>)::__0,void>
              ((function<std::optional<wasm::HeapType>(wasm::HeapType)> *)&local_4c8,
               (anon_class_1_0_00000001 *)((long)&__begin2._M_current + 7));
    HeapTypeOrdering::supertypesFirst<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
              (&local_4a8,
               (HeapTypeOrdering *)
               &dataFromSubsAndSupersMap.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_4c8,getSuper);
    std::function<std::optional<wasm::HeapType>_(wasm::HeapType)>::~function(&local_4c8);
    local_490 = &local_4a8;
    __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(local_490);
    type.id = (uintptr_t)
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(local_490);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                       *)&type), bVar3) {
      pHVar6 = __gnu_cxx::
               __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
               ::operator*(&__end2);
      fields = (FieldList *)pHVar6->id;
      bVar3 = HeapType::isStruct((HeapType *)&fields);
      if ((bVar3) &&
         (sVar7 = std::
                  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                  ::count((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                           *)local_470,(key_type *)&fields), sVar7 == 0)) {
        this_02 = HeapType::getStruct((HeapType *)&fields);
        this_03 = StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                            ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
                             &dataFromSupersMap.
                              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                              ._M_h._M_single_bucket,(HeapType)fields);
        this_04 = StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                            ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
                             &publicTypes.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(HeapType)fields);
        for (super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
            sVar8 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&this_02->fields),
            (uint)super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._12_4_ < sVar8;
            super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._12_4_ =
                 super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::HeapType>._12_4_ + 1) {
          pvVar9 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                             (&this_02->fields,
                              (ulong)(uint)super_1.super__Optional_base<wasm::HeapType,_true,_true>.
                                           _M_payload.super__Optional_payload_base<wasm::HeapType>.
                                           _12_4_);
          if ((pvVar9->mutable_ == Immutable) ||
             (pFVar10 = StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::
                        operator[](this_03,(ulong)(uint)super_1.
                                                  super__Optional_base<wasm::HeapType,_true,_true>.
                                                  _M_payload.
                                                  super__Optional_payload_base<wasm::HeapType>.
                                                  _12_4_), (pFVar10->hasWrite & 1U) != 0))
          goto LAB_01ca61aa;
          oVar21 = HeapType::getDeclaredSuperType((HeapType *)&fields);
          iter.
          super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
          ._M_cur = oVar21.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::HeapType>._M_payload;
          bVar3 = std::optional::operator_cast_to_bool((optional *)&iter);
          if (bVar3) {
            pHVar11 = std::optional<wasm::HeapType>::operator->((optional<wasm::HeapType> *)&iter);
            pSVar12 = HeapType::getStruct(pHVar11);
            sVar8 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&pSVar12->fields);
            if (sVar8 <= (uint)super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::HeapType>._12_4_)
            goto LAB_01ca610e;
            pHVar11 = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&iter);
            local_530._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                 ::find(&this->canBecomeImmutable,pHVar11);
            superVec = (vector<bool,_std::allocator<bool>_> *)
                       std::
                       unordered_map<wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                       ::end(&this->canBecomeImmutable);
            bVar3 = std::__detail::operator==
                              (&local_530,
                               (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                                *)&superVec);
            if (!bVar3) {
              ppVar13 = std::__detail::
                        _Node_iterator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_false,_true>
                        ::operator->((_Node_iterator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_false,_true>
                                      *)&local_530);
              local_540 = &ppVar13->second;
              sVar8 = std::vector<bool,_std::allocator<bool>_>::size(local_540);
              local_739 = 1;
              if ((uint)super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::HeapType>._12_4_ < sVar8) {
                rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   (local_540,
                                    (ulong)(uint)super_1.
                                                 super__Optional_base<wasm::HeapType,_true,_true>.
                                                 _M_payload.
                                                 super__Optional_payload_base<wasm::HeapType>._12_4_
                                   );
                local_548 = rVar22._M_mask;
                vec = (mapped_type *)rVar22._M_p;
                bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&vec);
                local_739 = bVar3 ^ 0xff;
              }
              if ((local_739 & 1) == 0) goto LAB_01ca610e;
            }
          }
          else {
LAB_01ca610e:
            this_05 = std::
                      unordered_map<wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                      ::operator[](&this->canBecomeImmutable,(key_type *)&fields);
            std::vector<bool,_std::allocator<bool>_>::resize
                      (this_05,(ulong)(super_1.super__Optional_base<wasm::HeapType,_true,_true>.
                                       _M_payload.super__Optional_payload_base<wasm::HeapType>.
                                       _12_4_ + 1),false);
            rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (this_05,(ulong)(uint)super_1.
                                                  super__Optional_base<wasm::HeapType,_true,_true>.
                                                  _M_payload.
                                                  super__Optional_payload_base<wasm::HeapType>.
                                                  _12_4_);
            removableIndexes._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)rVar22._M_p;
            std::_Bit_reference::operator=
                      ((_Bit_reference *)
                       &removableIndexes._M_t._M_impl.super__Rb_tree_header._M_node_count,true);
          }
LAB_01ca61aa:
        }
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   local_598);
        for (local_59c = 0; uVar14 = (ulong)local_59c,
            sVar8 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&this_02->fields),
            uVar14 < sVar8; local_59c = local_59c + 1) {
          pFVar10 = StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                              (this_03,(ulong)local_59c);
          bVar3 = pFVar10->hasRead;
          pFVar10 = StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                              (this_04,(ulong)local_59c);
          local_789 = 0;
          if ((pFVar10->hasRead & 1U) == 0) {
            pFVar10 = StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                                (this_04,(ulong)local_59c);
            local_789 = pFVar10->hasWrite ^ 0xff;
          }
          if (((~bVar3 & 1U) != 0) || ((local_789 & 1) != 0)) {
            pVar23 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)local_598,&local_59c);
            super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._8_8_ = pVar23.first._M_node;
          }
        }
        oVar21 = HeapType::getDeclaredSuperType((HeapType *)&fields);
        _Stack_5c0 = oVar21.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::HeapType>._M_payload;
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
             oVar21.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_engaged;
        bVar3 = std::optional::operator_cast_to_bool((optional *)&stack0xfffffffffffffa40);
        local_7b2 = false;
        if (bVar3) {
          pHVar11 = std::optional<wasm::HeapType>::operator*
                              ((optional<wasm::HeapType> *)&stack0xfffffffffffffa40);
          sVar15 = std::
                   unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                   ::count(&this->indexesAfterRemovals,pHVar11);
          local_7b2 = sVar15 != 0;
        }
        indexesAfterRemoval.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = local_7b2;
        bVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                empty((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      local_598);
        if ((!bVar3) ||
           ((indexesAfterRemoval.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0)) {
          sVar8 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&this_02->fields);
          std::allocator<unsigned_int>::allocator
                    ((allocator<unsigned_int> *)((long)&numSuperFields + 3));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&next,sVar8,
                     (allocator<unsigned_int> *)((long)&numSuperFields + 3));
          std::allocator<unsigned_int>::~allocator
                    ((allocator<unsigned_int> *)((long)&numSuperFields + 3));
          local_5e8 = 0;
          superIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          bVar3 = std::optional::operator_cast_to_bool((optional *)&stack0xfffffffffffffa40);
          if (bVar3) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iter_1);
            pHVar11 = std::optional<wasm::HeapType>::operator*
                                ((optional<wasm::HeapType> *)&stack0xfffffffffffffa40);
            local_610._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 ::find(&this->indexesAfterRemovals,pHVar11);
            local_618._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 ::end(&this->indexesAfterRemovals);
            bVar3 = std::__detail::operator!=(&local_610,&local_618);
            if (bVar3) {
              ppVar16 = std::__detail::
                        _Node_iterator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_true>
                        ::operator->((_Node_iterator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_true>
                                      *)&local_610);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iter_1,
                         &ppVar16->second);
            }
            else {
              pHVar11 = std::optional<wasm::HeapType>::operator->
                                  ((optional<wasm::HeapType> *)&stack0xfffffffffffffa40);
              pSVar12 = HeapType::getStruct(pHVar11);
              sVar8 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&pSVar12->fields)
              ;
              makeIdentity((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &keptFieldsNotInSuper.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(Index)sVar8);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iter_1,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &keptFieldsNotInSuper.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &keptFieldsNotInSuper.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
            }
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iter_1);
            superIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)sVar8;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&superIndex);
            for (local_64c = 0; uVar14 = (ulong)local_64c,
                sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iter_1),
                uVar14 < sVar8; local_64c = local_64c + 1) {
              pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iter_1,
                                   (ulong)local_64c);
              vVar1 = *pvVar20;
              local_650 = vVar1;
              if (vVar1 == 0xffffffff) {
                sVar19 = std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)local_598,&local_64c);
                if (sVar19 == 0) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&superIndex,
                             &local_64c);
                }
                else {
                  pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&next,
                                       (ulong)local_64c);
                  *pvVar20 = 0xffffffff;
                }
              }
              else {
                pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&next,
                                     (ulong)local_64c);
                *pvVar20 = vVar1;
                __range5._4_4_ = local_650 + 1;
                puVar17 = std::max<unsigned_int>(&local_5e8,(uint *)((long)&__range5 + 4));
                local_5e8 = *puVar17;
              }
            }
            __end5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&superIndex);
            _i_4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&superIndex);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end5,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                               *)&i_4), bVar3) {
              puVar18 = __gnu_cxx::
                        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator*(&__end5);
              uVar2 = local_5e8;
              local_674 = *puVar18;
              local_5e8 = local_5e8 + 1;
              pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&next,
                                   (ulong)local_674);
              *pvVar20 = uVar2;
              __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(&__end5);
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&superIndex);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iter_1);
          }
          for (local_678 = superIndexes.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_;
              uVar14 = (ulong)local_678,
              sVar8 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&this_02->fields)
              , uVar14 < sVar8; local_678 = local_678 + 1) {
            sVar19 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)local_598,&local_678);
            uVar2 = local_5e8;
            if (sVar19 == 0) {
              local_5e8 = local_5e8 + 1;
              pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&next,
                                   (ulong)local_678);
              *pvVar20 = uVar2;
            }
            else {
              pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&next,
                                   (ulong)local_678);
              *pvVar20 = 0xffffffff;
            }
          }
          sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&next);
          makeIdentity(&local_690,(Index)sVar8);
          bVar3 = std::operator!=((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&next,
                                  &local_690);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_690);
          if (bVar3) {
            this_06 = std::
                      unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                      ::operator[](&this->indexesAfterRemovals,(key_type *)&fields);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      (this_06,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&next);
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&next);
        }
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   local_598);
      }
      __gnu_cxx::
      __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
      ::operator++(&__end2);
    }
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_4a8);
    bVar3 = std::
            unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            ::empty(&this->indexesAfterRemovals);
    if (!bVar3) {
      removeFieldsInInstructions(this,local_18);
    }
    bVar3 = std::
            unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            ::empty(&this->indexesAfterRemovals);
    if ((!bVar3) ||
       (bVar3 = std::
                unordered_map<wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                ::empty(&this->canBecomeImmutable), !bVar3)) {
      updateTypes(this,local_18);
    }
    std::
    unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
    ::~unordered_set((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                      *)local_470);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &publicTypesSet._M_h._M_single_bucket);
    StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::~StructValuesMap
              ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &publicTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::~StructValuesMap
              ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &dataFromSupersMap.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket);
    StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo>::
    ~TypeHierarchyPropagator
              ((TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> *)
               &dataFromSubsAndSupersMap.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket);
    FieldInfoScanner::~FieldInfoScanner
              ((FieldInfoScanner *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::
    ~FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &scanner.
                super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
                .functionSetGetInfos);
    StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::
    ~FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &functionSetGetInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    if (!getPassOptions().closedWorld) {
      Fatal() << "GTO requires --closed-world";
    }

    // Find and analyze struct operations inside each function.
    StructUtils::FunctionStructValuesMap<FieldInfo> functionNewInfos(*module),
      functionSetGetInfos(*module);
    FieldInfoScanner scanner(functionNewInfos, functionSetGetInfos);
    scanner.run(getPassRunner(), module);
    scanner.runOnModuleCode(getPassRunner(), module);

    // Combine the data from the functions.
    functionSetGetInfos.combineInto(combinedSetGetInfos);
    // TODO: combine newInfos as well, once we have a need for that (we will
    //       when we do things like subtyping).

    // Propagate information to super and subtypes on set/get infos:
    //
    //  * For removing unread fields, we can only remove a field if it is never
    //    read in any sub or supertype, as such a read may alias any of those
    //    types (where the field is present).
    //
    //    Note that we *can* propagate reads only to supertypes, but we are
    //    limited in what we optimize. If type A has fields {a, b}, and its
    //    subtype B has the same fields, and if field a is only used in reads of
    //    type B, then we still cannot remove it. If we removed it then A would
    //    have fields {b}, that is, field b would be at index 0, while type B
    //    would still be {a, b} which has field b at index 1, which is not
    //    compatible. The only case in which we can optimize is to remove a
    //    field from the end, that is, we could remove field b from A.
    //    Otherwise, as mentioned before we can only remove a field if we also
    //    remove it from all sub- and super-types.
    //
    //  * For immutability, this is necessary because we cannot have a
    //    supertype's field be immutable while a subtype's is not - they must
    //    match for us to preserve subtyping.
    //
    //    Note that we do not need to care about types here: If the fields were
    //    mutable before, then they must have had identical types for them to be
    //    subtypes (as wasm only allows the type to differ if the fields are
    //    immutable). Note that by making more things immutable we therefore
    //    make it possible to apply more specific subtypes in subtype fields.
    StructUtils::TypeHierarchyPropagator<FieldInfo> propagator(*module);
    auto dataFromSubsAndSupersMap = combinedSetGetInfos;
    propagator.propagateToSuperAndSubTypes(dataFromSubsAndSupersMap);
    auto dataFromSupersMap = std::move(combinedSetGetInfos);
    propagator.propagateToSubTypes(dataFromSupersMap);

    // Find the public types, which we must not modify.
    auto publicTypes = ModuleUtils::getPublicHeapTypes(*module);
    std::unordered_set<HeapType> publicTypesSet(publicTypes.begin(),
                                                publicTypes.end());

    // Process the propagated info. We look at supertypes first, as the order of
    // fields in a supertype is a constraint on what subtypes can do. That is,
    // we decide for each supertype what the optimal order is, and consider that
    // fixed, and then subtypes can decide how to sort fields that they append.
    for (auto type :
         HeapTypeOrdering::supertypesFirst(propagator.subTypes.types)) {
      if (!type.isStruct() || publicTypesSet.count(type)) {
        continue;
      }
      auto& fields = type.getStruct().fields;
      auto& dataFromSubsAndSupers = dataFromSubsAndSupersMap[type];
      auto& dataFromSupers = dataFromSupersMap[type];

      // Process immutability.
      for (Index i = 0; i < fields.size(); i++) {
        if (fields[i].mutable_ == Immutable) {
          // Already immutable; nothing to do.
          continue;
        }

        if (dataFromSubsAndSupers[i].hasWrite) {
          // A set exists.
          continue;
        }

        // The propagation analysis ensures we update immutability in all
        // supers and subs in concert, but it does not take into account
        // visibility, so do that here: we can only become immutable if the
        // parent can as well.
        auto super = type.getDeclaredSuperType();
        if (super) {
          // The super may not contain the field, which is fine, so only check
          // here if the field does exist in both.
          if (i < super->getStruct().fields.size()) {
            // No entry in canBecomeImmutable means nothing in the parent can
            // become immutable, so check for both that and for an entry with
            // "false".
            auto iter = canBecomeImmutable.find(*super);
            if (iter == canBecomeImmutable.end()) {
              continue;
            }
            // The vector is grown only when needed to contain a "true" value,
            // so |i| being out of bounds indicates "false".
            auto& superVec = iter->second;
            if (i >= superVec.size() || !superVec[i]) {
              continue;
            }
          }
        }

        // No set exists. Mark it as something we can make immutable.
        auto& vec = canBecomeImmutable[type];
        vec.resize(i + 1);
        vec[i] = true;
      }

      // Process removability.
      std::set<Index> removableIndexes;
      for (Index i = 0; i < fields.size(); i++) {
        // If there is no read whatsoever, in either subs or supers, then we can
        // remove the field. That is so even if there are writes (it would be a
        // pointless "write-only field").
        auto hasNoReadsAnywhere = !dataFromSubsAndSupers[i].hasRead;

        // Check for reads or writes in ourselves and our supers. If there are
        // none, then operations only happen in our strict subtypes, and those
        // subtypes can define the field there, and we don't need it here.
        auto hasNoReadsOrWritesInSupers =
          !dataFromSupers[i].hasRead && !dataFromSupers[i].hasWrite;

        if (hasNoReadsAnywhere || hasNoReadsOrWritesInSupers) {
          removableIndexes.insert(i);
        }
      }

      // We need to compute the new set of indexes if we are removing fields, or
      // if our parent removed fields. In the latter case, our parent may have
      // reordered fields even if we ourselves are not removing anything, and we
      // must update to match the parent's order.
      auto super = type.getDeclaredSuperType();
      auto superHasUpdates = super && indexesAfterRemovals.count(*super);
      if (!removableIndexes.empty() || superHasUpdates) {
        // We are removing fields. Reorder them to allow that, as in the general
        // case we can only remove fields from the end, so that if our subtypes
        // still need the fields they can append them. For example:
        //
        //  type A     = { x: i32, y: f64 };
        //  type B : A = { x: 132, y: f64, z: v128 };
        //
        // If field x is used in B but never in A then we want to remove it, but
        // we cannot end up with this:
        //
        //  type A     = { y: f64 };
        //  type B : A = { x: 132, y: f64, z: v128 };
        //
        // Here B no longer extends A's fields. Instead, we reorder A, which
        // then imposes the same order on B's fields:
        //
        //  type A     = { y: f64, x: i32 };
        //  type B : A = { y: f64, x: i32, z: v128 };
        //
        // And after that, it is safe to remove x in A: B will then append it,
        // just like it appends z, leading to this:
        //
        //  type A     = { y: f64 };
        //  type B : A = { y: f64, x: i32, z: v128 };
        //
        std::vector<Index> indexesAfterRemoval(fields.size());

        // The next new index to use.
        Index next = 0;

        // If we have a super, then we extend it, and must match its fields.
        // That is, we can only append fields: we cannot reorder or remove any
        // field that is in the super.
        Index numSuperFields = 0;
        if (super) {
          // We have visited the super before. Get the information about its
          // fields.
          std::vector<Index> superIndexes;
          auto iter = indexesAfterRemovals.find(*super);
          if (iter != indexesAfterRemovals.end()) {
            superIndexes = iter->second;
          } else {
            // We did not store any information about the parent, because we
            // found nothing to optimize there. That means it is not removing or
            // reordering anything, so its new indexes are trivial.
            superIndexes = makeIdentity(super->getStruct().fields.size());
          }

          numSuperFields = superIndexes.size();

          // Fields we keep but the super removed will be handled at the end.
          std::vector<Index> keptFieldsNotInSuper;

          // Go over the super fields and handle them.
          for (Index i = 0; i < superIndexes.size(); ++i) {
            auto superIndex = superIndexes[i];
            if (superIndex == RemovedField) {
              if (removableIndexes.count(i)) {
                // This was removed in the super, and in us as well.
                indexesAfterRemoval[i] = RemovedField;
              } else {
                // This was removed in the super, but we actually need it. It
                // must appear after all other super fields, when we get to the
                // proper index for that, later. That is, we are reordering.
                keptFieldsNotInSuper.push_back(i);
              }
            } else {
              // The super kept this field, so we must keep it as well. This can
              // happen when we need the field in both, but also in the corner
              // case where we don't need the field but the super is public.

              // We need to keep it at the same index so we remain compatible.
              indexesAfterRemoval[i] = superIndex;
              // Update |next| to refer to the next available index. Due to
              // possible reordering in the parent, we may not see indexes in
              // order here, so just take the max at each point in time.
              next = std::max(next, superIndex + 1);
            }
          }

          // Handle fields we keep but the super removed.
          for (auto i : keptFieldsNotInSuper) {
            indexesAfterRemoval[i] = next++;
          }
        }

        // Go over the fields only defined in us, and not in any super.
        for (Index i = numSuperFields; i < fields.size(); ++i) {
          if (removableIndexes.count(i)) {
            indexesAfterRemoval[i] = RemovedField;
          } else {
            indexesAfterRemoval[i] = next++;
          }
        }

        // Only store the new indexes we computed if we found something
        // interesting. We might not, if e.g. our parent removes fields and we
        // add them back in the exact order we started with. In such cases,
        // avoid wasting memory and also time later.
        if (indexesAfterRemoval != makeIdentity(indexesAfterRemoval.size())) {
          indexesAfterRemovals[type] = indexesAfterRemoval;
        }
      }
    }

    // If we found fields that can be removed, remove them from instructions.
    // (Note that we must do this first, while we still have the old heap types
    // that we can identify, and only after this should we update all the types
    // throughout the module.)
    if (!indexesAfterRemovals.empty()) {
      removeFieldsInInstructions(*module);
    }

    // Update the types in the entire module.
    if (!indexesAfterRemovals.empty() || !canBecomeImmutable.empty()) {
      updateTypes(*module);
    }
  }